

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O2

mpc_val_t * mpc_parse_fold(mpc_input_t *i,mpc_fold_t f,int n,mpc_val_t **xs)

{
  undefined8 *p;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  void *pvVar4;
  mpc_val_t *pmVar5;
  size_t sVar6;
  char *__dest;
  undefined1 *puVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  int iStack_40;
  
  if (f == mpcf_null) {
    pmVar5 = (mpc_val_t *)0x0;
  }
  else if (f == mpcf_fst) {
    pmVar5 = *xs;
  }
  else if (f == mpcf_snd) {
    pmVar5 = xs[1];
  }
  else {
    if (f != mpcf_trd) {
      if (f == mpcf_fst_free) {
        iStack_40 = 0;
      }
      else if (f == mpcf_snd_free) {
        iStack_40 = 1;
      }
      else {
        if (f != mpcf_trd_free) {
          if (f == mpcf_strfold) {
            if (n != 0) {
              uVar9 = 0;
              uVar8 = 0;
              if (0 < n) {
                uVar8 = (ulong)(uint)n;
              }
              lVar10 = 0;
              for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
                sVar6 = strlen((char *)xs[uVar9]);
                lVar10 = lVar10 + sVar6;
              }
              __dest = (char *)mpc_realloc(i,*xs,lVar10 + 1);
              *xs = __dest;
              for (lVar10 = 1; lVar10 < n; lVar10 = lVar10 + 1) {
                strcat(__dest,(char *)xs[lVar10]);
                mpc_free(i,xs[lVar10]);
                __dest = (char *)*xs;
              }
              return __dest;
            }
            puVar7 = (undefined1 *)mpc_malloc(i,1);
            *puVar7 = 0;
            return puVar7;
          }
          if (f == mpcf_state_ast) {
            p = (undefined8 *)*xs;
            pmVar5 = xs[1];
            if (pmVar5 != (mpc_val_t *)0x0) {
              uVar1 = *p;
              uVar2 = p[1];
              uVar3 = p[3];
              *(undefined8 *)((long)pmVar5 + 0x20) = p[2];
              *(undefined8 *)((long)pmVar5 + 0x28) = uVar3;
              *(undefined8 *)((long)pmVar5 + 0x10) = uVar1;
              *(undefined8 *)((long)pmVar5 + 0x18) = uVar2;
            }
            mpc_free(i,p);
            return pmVar5;
          }
          uVar9 = 0;
          uVar8 = (ulong)(uint)n;
          if (n < 1) {
            uVar8 = uVar9;
          }
          for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
            pvVar4 = mpc_export(i,xs[uVar9]);
            xs[uVar9] = pvVar4;
          }
          pmVar5 = (*f)((int)uVar8,xs);
          return pmVar5;
        }
        iStack_40 = 2;
      }
      pmVar5 = mpcf_input_nth_free(i,n,xs,iStack_40);
      return pmVar5;
    }
    pmVar5 = xs[2];
  }
  return pmVar5;
}

Assistant:

static mpc_val_t *mpc_parse_fold(mpc_input_t *i, mpc_fold_t f, int n, mpc_val_t **xs) {
  int j;
  if (f == mpcf_null)      { return mpcf_null(n, xs); }
  if (f == mpcf_fst)       { return mpcf_fst(n, xs); }
  if (f == mpcf_snd)       { return mpcf_snd(n, xs); }
  if (f == mpcf_trd)       { return mpcf_trd(n, xs); }
  if (f == mpcf_fst_free)  { return mpcf_input_fst_free(i, n, xs); }
  if (f == mpcf_snd_free)  { return mpcf_input_snd_free(i, n, xs); }
  if (f == mpcf_trd_free)  { return mpcf_input_trd_free(i, n, xs); }
  if (f == mpcf_strfold)   { return mpcf_input_strfold(i, n, xs); }
  if (f == mpcf_state_ast) { return mpcf_input_state_ast(i, n, xs); }
  for (j = 0; j < n; j++) { xs[j] = mpc_export(i, xs[j]); }
  return f(j, xs);
}